

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::Assemble(TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this,TPZMatrix<std::complex<double>_> *matref,TPZFMatrix<std::complex<double>_> *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  undefined1 uVar1;
  ostream *poVar2;
  void *this_00;
  thread *this_01;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  **__args;
  int64_t iVar3;
  int extraout_var;
  long in_RDX;
  _func_int **in_RSI;
  long *in_RDI;
  TPZVec<int> *in_stack_00000078;
  TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
  *in_stack_00000080;
  TPZVec<int> numelconnected;
  int i;
  vector<std::thread,_std::allocator<std::thread>_> allthreads;
  int nthreads;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *mat;
  TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
  *in_stack_00000260;
  size_t in_stack_000002f8;
  char *in_stack_00000300;
  thread *in_stack_fffffffffffffed8;
  TPZAutoPointer<TPZGuiInterface> *in_stack_fffffffffffffee0;
  TPZFront<std::complex<double>_> *this_02;
  TPZVec<int> *in_stack_fffffffffffffee8;
  TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  int iVar4;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  TPZCompMesh *in_stack_ffffffffffffff10;
  _func_void_ptr_void_ptr *__f;
  long *local_d0;
  undefined1 local_90 [100];
  int local_2c;
  long *local_28;
  long local_18;
  _func_int **local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZAutoPointer<TPZGuiInterface>::operator=
            ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0)
  ;
  if (local_10 == (_func_int **)0x0) {
    local_d0 = (long *)0x0;
  }
  else {
    local_d0 = (long *)__dynamic_cast(local_10,&TPZMatrix<std::complex<double>>::typeinfo,
                                      &TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontSym<std::complex<double>>>
                                       ::typeinfo,0);
  }
  local_28 = local_d0;
  if (local_d0 == (long *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "virtual void TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>>, std::complex<double>>::Assemble(TPZMatrix<TVar> &, TPZFMatrix<TVar> &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontSym<std::complex<double>>, TVar = std::complex<double>, TPar = TPZStructMatrixOR<CSTATE>]"
                            );
    poVar2 = std::operator<<(poVar2," we are in serious trouble : wrong type of matrix");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000300,in_stack_000002f8);
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x60) + 8) < 3) {
    *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x60) + 8) = 3;
  }
  __f = (_func_void_ptr_void_ptr *)&std::cout;
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of Threads ");
  this_00 = (void *)std::ostream::operator<<
                              (poVar2,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x60) + 8));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_2c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x60) + 8);
  std::ostream::flush();
  this_01 = (thread *)(long)local_2c;
  std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1de2cfc);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
             ,(allocator_type *)in_stack_fffffffffffffef0);
  iVar4 = (int)(in_stack_fffffffffffffef8 >> 0x20);
  std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1de2d22);
  __args = (TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
            **)TPZCompMesh::NEquations(in_stack_ffffffffffffff10);
  local_90._12_4_ = 0;
  TPZVec<int>::TPZVec((TPZVec<int> *)in_stack_fffffffffffffef0,(int64_t)in_stack_fffffffffffffee8,
                      (int *)in_stack_fffffffffffffee0);
  iVar3 = TPZCompMesh::NElements((TPZCompMesh *)0x1de2d6c);
  in_RDI[0x1d] = iVar3;
  TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
  ::OrderElement(in_stack_00000260);
  TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
  ::GetNumElConnected(in_stack_00000080,in_stack_00000078);
  TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  ::SetNumElConnected(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  uVar1 = clarg::arg_base::was_set((arg_base *)&num_threads);
  if ((bool)uVar1) {
    (**(code **)(*local_28 + 0x278))();
    iVar4 = extraout_var;
    in_stack_fffffffffffffef0 =
         (TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
          *)clarg::argT<int>::get_value(&num_threads.super_argT<int>);
    TPZFront<std::complex<double>_>::ProductTensorMTInitData
              ((TPZFront<std::complex<double>_> *)CONCAT17(uVar1,in_stack_ffffffffffffff00),iVar4);
  }
  else {
    (**(code **)(*local_28 + 0x278))();
    TPZFront<std::complex<double>_>::ProductTensorMTInitData
              ((TPZFront<std::complex<double>_> *)CONCAT17(uVar1,in_stack_ffffffffffffff00),iVar4);
  }
  in_RDI[0x1f] = (long)local_28;
  in_RDI[0x20] = local_18;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  std::thread::
  thread<void*(&)(void*),TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>>,std::complex<double>,TPZStructMatrixOR<std::complex<double>>>*,void>
            (this_01,__f,
             (TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
              **)__args);
  std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
            ((vector<std::thread,_std::allocator<std::thread>_> *)(local_90 + 0x48),
             (long)(local_2c + -1));
  this_02 = (TPZFront<std::complex<double>_> *)local_90;
  std::thread::operator=((thread *)this_02,in_stack_fffffffffffffed8);
  std::thread::~thread((thread *)0x1de2f4a);
  std::thread::
  thread<void*(&)(void*),TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontSym<std::complex<double>>>*&,void>
            (this_01,__f,__args);
  std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
            ((vector<std::thread,_std::allocator<std::thread>_> *)(local_90 + 0x48),
             (long)(local_2c + -2));
  std::thread::operator=((thread *)this_02,in_stack_fffffffffffffed8);
  std::thread::~thread((thread *)0x1de2f9f);
  for (local_90._48_4_ = 0; (int)local_90._48_4_ < local_2c + -2;
      local_90._48_4_ = local_90._48_4_ + 1) {
    std::thread::
    thread<void*(&)(void*),TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>>,std::complex<double>,TPZStructMatrixOR<std::complex<double>>>*,void>
              (this_01,__f,
               (TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                **)__args);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)(local_90 + 0x48),
               (long)(int)local_90._48_4_);
    std::thread::operator=((thread *)this_02,in_stack_fffffffffffffed8);
    std::thread::~thread((thread *)0x1de3016);
  }
  for (local_90._48_4_ = 0; (int)local_90._48_4_ < local_2c; local_90._48_4_ = local_90._48_4_ + 1)
  {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)(local_90 + 0x48),
               (long)(int)local_90._48_4_);
    std::thread::join();
  }
  (**(code **)(*local_28 + 0x278))();
  TPZFront<std::complex<double>_>::ProductTensorMTFinish(this_02);
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  TPZVec<int>::~TPZVec((TPZVec<int> *)this_02);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffef0);
  return;
}

Assistant:

void TPZParFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZMatrix<TVar> & matref, TPZFMatrix<TVar> & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface)
{
	this->fGuiInterface = guiInterface;
	
#ifdef STACKSTORAGE
	TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *>(&matref);
#else
    TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (&matref);
    
#endif
	if(!mat)
	{
		std::cout << __PRETTY_FUNCTION__ << " we are in serious trouble : wrong type of matrix"<< std::endl;
		DebugStop();
	}
	
	int nthreads;
	//cout << "Number of Threads " << endl;
	//cin >> nthreads;
	//fNThreads = nthreads;
    if (this->fNumThreads < 3) {
        this->fNumThreads = 3;
    }
	std::cout << "Number of Threads " << this->fNumThreads << std::endl;
	nthreads = this->fNumThreads;
	std::cout.flush();
	//int nthreads = fNThreads+1;
	
    std::vector<std::thread> allthreads(nthreads);
	int i;
	
	TPZVec <int> numelconnected(this->fMesh->NEquations(),0);
	//TPZFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZStackEqnStorage, TFront>(fMesh->NEquations());
	
	//TPZFrontMatrix<TPZFileEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZFileEqnStorage, TFront>(fMesh->NEquations());
	
	
	
	
	//TPZParFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZParFrontMatrix<TPZStackEqnStorage, TFront>(this->fMesh->NEquations());
	fNElements = this->fMesh->NElements();
	
	this->OrderElement();
	
//	this->AdjustSequenceNumbering();
    
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        this->fMesh->Print(sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
	
	this->GetNumElConnected(numelconnected);
	
	mat->SetNumElConnected(numelconnected);
	
    if (num_threads.was_set())
        mat->GetFront().ProductTensorMTInitData(num_threads.get_value());
    else
        mat->GetFront().ProductTensorMTInitData( nthreads - 2 ); // Here it initializes the multthread decomposition (comment to deactivate. Remember to coment the Finish also)
	
	fStiffness = mat;
	fRhs = &rhs;
	fCurrentElement = 0;
	fCurrentAssembled = 0;
    
	/*
	 *Triger 'n' threads passing Assemble as argument
	 */
	// try{
    allthreads[nthreads-1] = std::thread(this->GlobalAssemble,this);
//                                        this->GlobalAssemble, this, __FUNCTION__);
//	if(!res[nthreads-1]){
//#ifdef VC
//		cout << "GlobalAssemble Thread created Successfuly "<< allthreads[nthreads-1].x << endl;
//#else
//		std::cout << "GlobalAssemble Thread created Successfuly "<< allthreads[nthreads-1] << std::endl;
//#endif
//		std::cout.flush();
//	}else{
//#ifdef VC
//		std::cout << "GlobalAssemble Thread Fail "<< allthreads[nthreads-1].x << std::endl;
//#else
//		std::cout << "GlobalAssemble Thread Fail "<< allthreads[nthreads-1] << std::endl;
//#endif
//		std::cout.flush();
//		//          DebugStop();
//	}
    allthreads[nthreads-2] = std::thread(mat->WriteFile,mat);
//                                        mat->WriteFile, mat, __FUNCTION__);
//	if(!res[nthreads-2]){
//#ifdef VC
//		cout << "WriteFile Thread created Successfuly "<< allthreads[nthreads-2].x << endl;
//#else
//		std::cout << "WriteFile Thread created Successfuly "<< allthreads[nthreads-2] << std::endl;
//#endif
//		std::cout.flush();
//	}else{
//#ifdef VC
//		std::cout << "WriteFile Thread Fail "<< allthreads[nthreads-2].x << std::endl;
//#else
//		std::cout << "WriteFile Thread Fail "<< allthreads[nthreads-2] << std::endl;
//#endif
//		std::cout.flush();
//		//          DebugStop();
//	}
	
	for(i=0;i<nthreads-2;i++){
        allthreads[i] = std::thread(this->ElementAssemble,this);
//		if(!res[i]){
//#ifdef VC
//			cout << "ElementAssemble Thread "<< i+1 <<  " created Successfuly "<< allthreads[i].x << endl;
//#else
//			std::cout << "ElementAssemble Thread "<< i+1 <<  " created Successfuly "<< allthreads[i] << std::endl;
//#endif
//			std::cout.flush();
//		}else{
//			std::cout << "Error " << res[i] << "\t";
//#ifdef VC
//			std::cout << "ElementAssemble Thread "<< i+1 << " Fail " << allthreads[i].x << std::endl;
//#else
//			std::cout << "ElementAssemble Thread "<< i+1 << " Fail " << allthreads[i] << std::endl;
//#endif
//			std::cout.flush();
//		}
	}
	for(i=0;i<nthreads;i++) {
        allthreads[i].join();
	}
	
	mat->GetFront().ProductTensorMTFinish(); // Here it ends the multthread decomposition (comment to deactivate. Remember to coment the initialization also)
	fStiffness = 0;
	fRhs = 0;
    
}